

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool __thiscall
LLVMBC::ModuleParseContext::parse_type(ModuleParseContext *this,BlockOrRecord *child)

{
  ulong uVar1;
  pointer puVar2;
  pointer ppTVar3;
  ulong *puVar4;
  LoggingCallback p_Var5;
  void *pvVar6;
  FunctionType *type;
  uint i;
  bool bVar7;
  size_t i_1;
  ulong uVar8;
  ulong __n;
  uint in_stack_ffffffffffffef9c;
  Type *func_type;
  Type *in_stack_ffffffffffffefa8;
  Vector<Type_*> members;
  
  bVar7 = true;
  switch(child->id) {
  case 1:
  case 0x13:
    goto switchD_00175429_caseD_1;
  case 2:
    type = (FunctionType *)Type::getVoidTy(this->context);
    break;
  case 3:
    type = (FunctionType *)Type::getFloatTy(this->context);
    break;
  case 4:
    type = (FunctionType *)Type::getDoubleTy(this->context);
    break;
  case 5:
    type = (FunctionType *)Type::getLabelTy(this->context);
    break;
  case 6:
    type = (FunctionType *)Type::getOpaqueTy(this->context);
    break;
  case 7:
    puVar4 = (child->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (((child->ops).
         super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish == puVar4) || (uVar8 = *puVar4, 0x40 < uVar8))
    goto LAB_00175793;
    type = (FunctionType *)Type::getIntTy(this->context,(uint32_t)uVar8);
    break;
  case 8:
    puVar4 = (child->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(child->ops).
                          super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4)) {
      uVar8 = *puVar4;
      ppTVar3 = (this->types).
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((uVar8 < (ulong)((long)(this->types).
                                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3))
         && (ppTVar3[uVar8] != (Type *)0x0)) {
        type = (FunctionType *)PointerType::get(in_stack_ffffffffffffefa8,in_stack_ffffffffffffef9c)
        ;
        break;
      }
    }
    goto LAB_00175793;
  default:
    p_Var5 = dxil_spv::get_thread_log_callback();
    if (p_Var5 == (LoggingCallback)0x0) {
      fwrite("[ERROR]: Unknown type!\n",0x17,1,_stderr);
      fflush(_stderr);
    }
    else {
      members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_7_ = 0xa2165707974;
      members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start._0_7_ = 0x6e776f6e6b6e55;
      members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start._7_1_ = 0x20;
      pvVar6 = dxil_spv::get_thread_log_callback_userdata();
      (*p_Var5)(pvVar6,Error,(char *)&members);
    }
    goto LAB_00175793;
  case 10:
    type = (FunctionType *)Type::getHalfTy(this->context);
    break;
  case 0xb:
    puVar2 = (child->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(child->ops).
                          super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
      uVar8 = puVar2[1];
      ppTVar3 = (this->types).
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((uVar8 < (ulong)((long)(this->types).
                                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3))
         && (ppTVar3[uVar8] != (Type *)0x0)) {
        type = (FunctionType *)ArrayType::get(in_stack_ffffffffffffefa8,(uint64_t)func_type);
        break;
      }
    }
    goto LAB_00175793;
  case 0xc:
    puVar2 = (child->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(child->ops).
                          super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
      uVar8 = puVar2[1];
      ppTVar3 = (this->types).
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((uVar8 < (ulong)((long)(this->types).
                                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3))
         && (ppTVar3[uVar8] != (Type *)0x0)) {
        type = (FunctionType *)VectorType::get(in_stack_ffffffffffffef9c,in_stack_ffffffffffffefa8);
        break;
      }
    }
    goto LAB_00175793;
  case 0x10:
    type = (FunctionType *)Type::getMetadataTy(this->context);
    break;
  case 0x12:
  case 0x14:
    uVar8 = (long)(child->ops).
                  super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(child->ops).
                  super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar8 == 0) goto LAB_00175793;
    members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_start._0_7_ = 0;
    members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_start._7_1_ = 0;
    members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_7_ = 0;
    members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_finish._7_1_ = 0;
    members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n = (ulong)((int)(uVar8 >> 3) - 1);
    std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::reserve
              ((vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)&members,
               __n);
    for (uVar8 = 0; __n != uVar8; uVar8 = uVar8 + 1) {
      uVar1 = (child->ops).
              super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 + 1];
      ppTVar3 = (this->types).
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (uVar1 < (ulong)((long)(this->types).
                                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3)) {
        func_type = ppTVar3[uVar1];
      }
      else {
        func_type = (Type *)0x0;
      }
      std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
      emplace_back<LLVMBC::Type*>
                ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)&members,
                 &func_type);
    }
    members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_start._0_7_ = 0;
    members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_start._7_1_ = 0;
    members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_7_ = 0;
    members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_finish._7_1_ = 0;
    members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type = (FunctionType *)StructType::get(this->context,(Vector<Type_*> *)&stack0xffffffffffffefa8)
    ;
    std::_Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::
    ~_Vector_base((_Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)
                  &stack0xffffffffffffefa8);
    std::_Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::
    ~_Vector_base(&members.
                   super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                 );
    break;
  case 0x15:
    uVar8 = (long)(child->ops).
                  super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(child->ops).
                  super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (1 < uVar8) {
      members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start._0_7_ = 0;
      members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start._7_1_ = 0;
      members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_7_ = 0;
      members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish._7_1_ = 0;
      members.super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::reserve
                ((vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_> *)&members
                 ,uVar8 - 2);
      for (uVar8 = 2;
          puVar2 = (child->ops).
                   super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar8 < (ulong)((long)(child->ops).
                                super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
          uVar8 = uVar8 + 1) {
        ppTVar3 = (this->types).
                  super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (puVar2[uVar8] <
            (ulong)((long)(this->types).
                          super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3)) {
          func_type = ppTVar3[puVar2[uVar8]];
        }
        else {
          func_type = (Type *)0x0;
        }
        std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
        emplace_back<LLVMBC::Type*>
                  ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)&members,
                   &func_type);
      }
      ppTVar3 = (this->types).
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar7 = true;
      if (puVar2[1] <
          (ulong)((long)(this->types).
                        super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3)) {
        func_type = ppTVar3[puVar2[1]];
        if (func_type == (Type *)0x0) {
          type = (FunctionType *)0x0;
        }
        else {
          type = LLVMContext::
                 construct<LLVMBC::FunctionType,LLVMBC::LLVMContext&,LLVMBC::Type*&,std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>>
                           (this->context,this->context,&func_type,&members);
          bVar7 = false;
        }
      }
      else {
        type = (FunctionType *)0x0;
      }
      std::_Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::
      ~_Vector_base(&members.
                     super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                   );
      if (!bVar7) break;
    }
LAB_00175793:
    bVar7 = false;
    goto switchD_00175429_caseD_1;
  }
  bVar7 = true;
  add_type(this,&type->super_Type);
switchD_00175429_caseD_1:
  return bVar7;
}

Assistant:

bool ModuleParseContext::parse_type(const BlockOrRecord &child)
{
	Type *type = nullptr;
	switch (TypeRecord(child.id))
	{
	case TypeRecord::NUMENTRY:
	case TypeRecord::STRUCT_NAME:
		return true;

	case TypeRecord::VOID_TYPE:
		type = Type::getVoidTy(*context);
		break;

	case TypeRecord::HALF:
		type = Type::getHalfTy(*context);
		break;

	case TypeRecord::FLOAT:
		type = Type::getFloatTy(*context);
		break;

	case TypeRecord::DOUBLE:
		type = Type::getDoubleTy(*context);
		break;

	case TypeRecord::POINTER:
	{
		if (child.ops.size() < 2)
			return false;

		auto *pointee_type = get_type(child.ops[0]);
		if (!pointee_type)
			return false;
		type = PointerType::get(pointee_type, child.ops[1]);
		break;
	}

	case TypeRecord::ARRAY:
	{
		if (child.ops.size() < 2)
			return false;

		auto *elem_type = get_type(child.ops[1]);
		if (!elem_type)
			return false;
		type = ArrayType::get(elem_type, child.ops[0]);
		break;
	}

	case TypeRecord::INTEGER:
	{
		if (child.ops.size() < 1)
			return false;

		auto bit_width = child.ops[0];
		if (bit_width <= 64)
			type = Type::getIntTy(*context, unsigned(bit_width));
		else
			return false;
		break;
	}

	case TypeRecord::STRUCT_NAMED:
	case TypeRecord::STRUCT_ANON:
	{
		if (child.ops.size() < 1)
			return false;

		Vector<Type *> members;
		unsigned num_members = child.ops.size() - 1;
		members.reserve(num_members);
		for (unsigned i = 0; i < num_members; i++)
			members.push_back(get_type(child.ops[i + 1]));
		type = StructType::get(*context, std::move(members));
		break;
	}

	case TypeRecord::VECTOR:
	{
		if (child.ops.size() < 2)
			return false;

		auto *elem_type = get_type(child.ops[1]);
		if (!elem_type)
			return false;
		type = VectorType::get(child.ops[0], elem_type);
		break;
	}

	case TypeRecord::FUNCTION:
	{
		if (child.ops.size() < 2)
			return false;
		Vector<Type *> argument_types;
		argument_types.reserve(child.ops.size() - 2);
		for (size_t i = 2; i < child.ops.size(); i++)
			argument_types.push_back(get_type(child.ops[i]));

		auto *func_type = get_type(child.ops[1]);
		if (!func_type)
			return false;

		type = context->construct<FunctionType>(*context, func_type, std::move(argument_types));
		break;
	}

	case TypeRecord::LABEL:
	{
		type = Type::getLabelTy(*context);
		break;
	}

	case TypeRecord::METADATA:
	{
		type = Type::getMetadataTy(*context);
		break;
	}

	case TypeRecord::OPAQUE_TYPE:
	{
		type = Type::getOpaqueTy(*context);
		break;
	}

	default:
		LOGE("Unknown type!\n");
		return false;
	}

	add_type(type);
	return true;
}